

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyMemory.cpp
# Opt level: O1

Var Js::WebAssemblyMemory::EntryGetterBuffer(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  ArrayBufferBase *pAVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Var pvVar6;
  WebAssemblyMemory *pWVar7;
  int in_stack_00000010;
  ArrayBufferBase *local_48;
  undefined1 local_40 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyMemory.cpp"
                                ,0x112,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00d9d450;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_40 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_40,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyMemory.cpp"
                                ,0x115,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00d9d450;
    *puVar5 = 0;
  }
  if (((ulong)local_40 & 0xffffff) != 0) {
    pvVar6 = Arguments::operator[]((Arguments *)local_40,0);
    bVar4 = VarIs<Js::WebAssemblyMemory>(pvVar6);
    if (bVar4) {
      pvVar6 = Arguments::operator[]((Arguments *)local_40,0);
      pWVar7 = VarTo<Js::WebAssemblyMemory>(pvVar6);
      pAVar2 = (pWVar7->m_buffer).ptr;
      Memory::Recycler::WBSetBit((char *)&local_48);
      local_48 = pAVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
      bVar4 = VarIsImpl<Js::ArrayBufferBase>((RecyclableObject *)local_48);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyMemory.cpp"
                                    ,0x11d,"(VarIsCorrectType(memory->m_buffer))",
                                    "VarIsCorrectType(memory->m_buffer)");
        if (!bVar4) {
LAB_00d9d450:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
      }
      pvVar6 = CrossSite::MarshalVar(pSVar1,(pWVar7->m_buffer).ptr,false);
      return pvVar6;
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5e4a0,(PCWSTR)0x0);
}

Assistant:

Var
WebAssemblyMemory::EntryGetterBuffer(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count == 0 || !VarIs<WebAssemblyMemory>(args[0]))
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedMemoryObject);
    }

    WebAssemblyMemory* memory = VarTo<WebAssemblyMemory>(args[0]);
    Assert(VarIsCorrectType(memory->m_buffer));
    return CrossSite::MarshalVar(scriptContext, memory->m_buffer);
}